

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

bool __thiscall
FIX::SocketAcceptor::onData(SocketAcceptor *this,SocketServer *server,socket_handle s)

{
  bool bVar1;
  pointer ppVar2;
  ssize_t sVar3;
  size_t in_RCX;
  SocketConnection *pSocketConnection;
  _Self local_30;
  iterator i;
  socket_handle s_local;
  SocketServer *server_local;
  SocketAcceptor *this_local;
  
  i._M_node._4_4_ = s;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::find(&this->m_connections,(key_type *)((long)&i._M_node + 4));
  pSocketConnection =
       (SocketConnection *)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::end(&this->m_connections);
  bVar1 = std::operator==(&local_30,(_Self *)&pSocketConnection);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       (&local_30);
    sVar3 = SocketConnection::read(ppVar2->second,(int)this,server,in_RCX);
    this_local._7_1_ = (bool)((byte)sVar3 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool SocketAcceptor::onData(SocketServer &server, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  if (i == m_connections.end()) {
    return false;
  }
  SocketConnection *pSocketConnection = i->second;
  return pSocketConnection->read(*this, server);
}